

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::Int32Size(RepeatedField<int> *value)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  undefined4 local_20;
  int i;
  int n;
  size_t out;
  RepeatedField<int> *value_local;
  
  _i = 0;
  iVar1 = RepeatedField<int>::size(value);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    piVar2 = RepeatedField<int>::Get(value,local_20);
    sVar3 = Int32Size(*piVar2);
    _i = sVar3 + _i;
  }
  return _i;
}

Assistant:

size_t WireFormatLite::Int32Size(const RepeatedField<int32>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += Int32Size(value.Get(i));
  }
  return out;
}